

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

void __thiscall
FuncInfo::FuncInfo(FuncInfo *this,char16 *name,ArenaAllocator *alloc,
                  ByteCodeGenerator *byteCodeGenerator,Scope *paramScope,Scope *bodyScope,
                  ParseNodeFnc *pnode,ParseableFunctionInfo *byteCodeFunction)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  undefined1 auVar6 [16];
  
  auVar6 = ZEXT816(0);
  this->capturedSymMap = (CapturedSymMap *)auVar6._0_8_;
  this->nextForInLoopLevel = auVar6._8_4_;
  this->maxForInLoopLevel = auVar6._12_4_;
  this->currentChildScope = (Scope *)auVar6._0_8_;
  this->capturedSyms = (SymbolTable *)auVar6._8_8_;
  this->isInstInlineCacheCount = auVar6._0_4_;
  this->referencedPropertyIdCount = auVar6._4_4_;
  this->currentChildFunction = (FuncInfo *)auVar6._8_8_;
  this->inlineCacheCount = auVar6._0_4_;
  this->rootObjectLoadInlineCacheCount = auVar6._4_4_;
  this->rootObjectLoadMethodInlineCacheCount = auVar6._8_4_;
  this->rootObjectStoreInlineCacheCount = auVar6._12_4_;
  this->alloc = alloc;
  this->varRegsCount = 0;
  this->constRegsCount = 2;
  this->inArgsCount = 0;
  auVar6 = pmovsxbd(auVar6,0xff000000);
  this->outArgsMaxDepth = auVar6._0_4_;
  this->outArgsCurrentExpr = auVar6._4_4_;
  this->innerScopeCount = auVar6._8_4_;
  this->currentInnerScopeIndex = auVar6._12_4_;
  this->outArgsDepth = 0;
  this->name = name;
  this->nullConstantRegister = 0xffffffff;
  this->undefinedConstantRegister = 0xffffffff;
  this->trueConstantRegister = 0xffffffff;
  this->falseConstantRegister = 0xffffffff;
  this->thisConstantRegister = 0xffffffff;
  this->envRegister = 0xffffffff;
  this->frameObjRegister = 0xffffffff;
  this->frameSlotsRegister = 0xffffffff;
  this->paramSlotsRegister = 0xffffffff;
  this->frameDisplayRegister = 0xffffffff;
  this->funcObjRegister = 0xffffffff;
  this->localClosureReg = 0xffffffff;
  this->awaitRegister = 0xffffffff;
  this->yieldRegister = 0xffffffff;
  this->firstTmpReg = 0xffffffff;
  this->curTmpReg = 0xffffffff;
  this->argsPlaceHolderSlotCount = 0;
  *(uint *)&this->field_0xb4 = *(uint *)&this->field_0xb4 & 0xfffe0000 | 0x8000;
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->constantToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<Ident_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->doubleConstantToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->bigintToRegister,alloc,0x11);
  JsUtil::
  BaseDictionary<ParseNode_*,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->stringTemplateCallsiteRegisterMap,alloc,0x11);
  this->paramScope = paramScope;
  this->bodyScope = bodyScope;
  this->funcExprScope = (Scope *)0x0;
  this->root = pnode;
  this->byteCodeFunction = byteCodeFunction;
  (this->targetStatements).super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->targetStatements;
  (this->targetStatements).super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->targetStatements).allocator = alloc;
  this->singleExit = 0;
  this->rootObjectLoadInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->rootObjectLoadMethodInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->rootObjectStoreInlineCacheMap = (RootObjectInlineCacheIdMap *)0x0;
  this->inlineCacheMap = (InlineCacheMap *)0x0;
  this->referencedPropertyIdToMapIndex = (ReferencedPropertyIdMap *)0x0;
  this->callSiteToCallApplyCallSiteMap = (CallSiteToCallApplyCallSiteMap *)0x0;
  (this->valueOfStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->valueOfStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->valueOfStoreCacheIds).super_RealCount.count = 0;
  (this->toStringStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->toStringStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->toStringStoreCacheIds).super_RealCount.count = 0;
  JsUtil::
  BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->slotProfileIdMap,alloc,0);
  this->superSymbol = (Symbol *)0x0;
  this->superConstructorSymbol = (Symbol *)0x0;
  this->newTargetSymbol = (Symbol *)0x0;
  this->importMetaSymbol = (Symbol *)0x0;
  this->argumentsSymbol = (Symbol *)0x0;
  this->thisSymbol = (Symbol *)0x0;
  (this->nonUserNonTempRegistersToInitialize).
  super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.alloc = alloc;
  (this->nonUserNonTempRegistersToInitialize).
  super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_014d5058;
  (this->nonUserNonTempRegistersToInitialize).
  super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->nonUserNonTempRegistersToInitialize).
  super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->nonUserNonTempRegistersToInitialize).length = 0;
  (this->nonUserNonTempRegistersToInitialize).increment = 4;
  if (bodyScope != (Scope *)0x0) {
    bodyScope->func = this;
  }
  if (paramScope != (Scope *)0x0) {
    paramScope->func = this;
  }
  if ((pnode != (ParseNodeFnc *)0x0) && (pnode->nestedFuncEscapes == true)) {
    SetHasMaybeEscapedNestedFunc(this,L"Child");
  }
  if (byteCodeFunction != (ParseableFunctionInfo *)0x0) {
    pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4f1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4f2,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    if ((pFVar5->attributes & (DeferredParse|DeferredDeserialize)) != None) {
      return;
    }
    if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    if ((pFVar5->attributes & CanDefer) == None) {
      return;
    }
    if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    *(Type *)&this->field_0xb4 =
         *(uint *)&this->field_0xb4 & 0xfffffffe | pFVar5->attributes >> 0x13 & 1;
    ByteCodeGenerator::AddFuncInfoToFinalizationSet(byteCodeGenerator,this);
    pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_0089e1e9;
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    TVar1 = pFVar5->attributes;
    if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) {
LAB_0089e1e9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pFVar5 = (byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
    }
    pFVar5->attributes = TVar1 & ~CanDefer;
  }
  return;
}

Assistant:

FuncInfo::FuncInfo(
    const char16 *name,
    ArenaAllocator *alloc,
    ByteCodeGenerator *byteCodeGenerator,
    Scope *paramScope,
    Scope *bodyScope,
    ParseNodeFnc *pnode,
    Js::ParseableFunctionInfo* byteCodeFunction)
    :
    inlineCacheCount(0),
    rootObjectLoadInlineCacheCount(0),
    rootObjectLoadMethodInlineCacheCount(0),
    rootObjectStoreInlineCacheCount(0),
    isInstInlineCacheCount(0),
    referencedPropertyIdCount(0),
    currentChildFunction(nullptr),
    currentChildScope(nullptr),
    capturedSyms(nullptr),
    capturedSymMap(nullptr),
    nextForInLoopLevel(0),
    maxForInLoopLevel(0),
    alloc(alloc),
    varRegsCount(0),
    constRegsCount(InitialConstRegsCount),
    inArgsCount(0),
    outArgsMaxDepth(0),
    outArgsCurrentExpr(0),
    innerScopeCount(0),
    currentInnerScopeIndex((uint)-1),
#if DBG
    outArgsDepth(0),
#endif
    name(name),
    nullConstantRegister(Js::Constants::NoRegister),
    undefinedConstantRegister(Js::Constants::NoRegister),
    trueConstantRegister(Js::Constants::NoRegister),
    falseConstantRegister(Js::Constants::NoRegister),
    thisConstantRegister(Js::Constants::NoRegister),
    envRegister(Js::Constants::NoRegister),
    frameObjRegister(Js::Constants::NoRegister),
    frameSlotsRegister(Js::Constants::NoRegister),
    paramSlotsRegister(Js::Constants::NoRegister),
    frameDisplayRegister(Js::Constants::NoRegister),
    funcObjRegister(Js::Constants::NoRegister),
    localClosureReg(Js::Constants::NoRegister),
    awaitRegister(Js::Constants::NoRegister),
    yieldRegister(Js::Constants::NoRegister),
    firstTmpReg(Js::Constants::NoRegister),
    curTmpReg(Js::Constants::NoRegister),
    argsPlaceHolderSlotCount(0),

    canDefer(false),
    callsEval(false),
    childCallsEval(false),
    hasArguments(false),
    hasHeapArguments(false),
    isTopLevelEventHandler(false),
    hasLocalInClosure(false),
    hasClosureReference(false),
    hasCachedScope(false),
    funcExprNameReference(false),
    applyEnclosesArgs(false),
    escapes(false),
    hasLoop(false),
    hasEscapedUseNestedFunc(false),
    needEnvRegister(false),
    isBodyAndParamScopeMerged(true),
#if DBG
    isReused(false),
#endif

    constantToRegister(alloc, 17),
    stringToRegister(alloc, 17),
    bigintToRegister(alloc, 17),
    doubleConstantToRegister(alloc, 17),
    stringTemplateCallsiteRegisterMap(alloc, 17),

    paramScope(paramScope),
    bodyScope(bodyScope),
    funcExprScope(nullptr),
    root(pnode),
    byteCodeFunction(byteCodeFunction),
    targetStatements(alloc),
    singleExit(0),
    rootObjectLoadInlineCacheMap(nullptr),
    rootObjectLoadMethodInlineCacheMap(nullptr),
    rootObjectStoreInlineCacheMap(nullptr),
    inlineCacheMap(nullptr),
    referencedPropertyIdToMapIndex(nullptr),
    callSiteToCallApplyCallSiteMap(nullptr),
    valueOfStoreCacheIds(),
    toStringStoreCacheIds(),
    slotProfileIdMap(alloc),
    argumentsSymbol(nullptr),
    thisSymbol(nullptr),
    newTargetSymbol(nullptr),
    superSymbol(nullptr),
    superConstructorSymbol(nullptr),
    importMetaSymbol(nullptr),
    nonUserNonTempRegistersToInitialize(alloc)
{
    if (bodyScope != nullptr)
    {
        bodyScope->SetFunc(this);
    }
    if (paramScope != nullptr)
    {
        paramScope->SetFunc(this);
    }
    if (pnode && pnode->NestedFuncEscapes())
    {
        this->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
    }

    if (byteCodeFunction && !byteCodeFunction->IsDeferred() && byteCodeFunction->CanBeDeferred())
    {
        // Disable (re-)deferral of this function temporarily. Add it to the list of FuncInfo's to be processed when 
        // byte code gen is done.
        this->canDefer = !!(byteCodeFunction->GetAttributes() & Js::FunctionInfo::Attributes::CanDefer);
        byteCodeGenerator->AddFuncInfoToFinalizationSet(this);
        byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(byteCodeFunction->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
    }
}